

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Collision_PDU.cpp
# Opt level: O3

KBOOL __thiscall KDIS::PDU::Collision_PDU::operator==(Collision_PDU *this,Collision_PDU *Value)

{
  KBOOL KVar1;
  
  KVar1 = Header7::operator!=(&this->super_Header,&Value->super_Header);
  if (((((!KVar1) &&
        (KVar1 = DATA_TYPE::EntityIdentifier::operator!=
                           (&this->m_IssuingEntityID,&Value->m_IssuingEntityID), !KVar1)) &&
       (KVar1 = DATA_TYPE::EntityIdentifier::operator!=
                          (&this->m_CollidingEntityID,&Value->m_CollidingEntityID), !KVar1)) &&
      ((KVar1 = DATA_TYPE::EntityIdentifier::operator!=(&this->m_EventID,&Value->m_EventID), !KVar1
       && (this->m_ui8CollisionType == Value->m_ui8CollisionType)))) &&
     (KVar1 = DATA_TYPE::Vector::operator!=(&this->m_Velocity,&Value->m_Velocity), !KVar1)) {
    if (((float)this->m_f32Mass == (float)Value->m_f32Mass) &&
       (!NAN((float)this->m_f32Mass) && !NAN((float)Value->m_f32Mass))) {
      KVar1 = DATA_TYPE::Vector::operator!=(&this->m_Location,&Value->m_Location);
      return !KVar1;
    }
  }
  return false;
}

Assistant:

KBOOL Collision_PDU::operator == ( const Collision_PDU & Value ) const
{
    if( Header::operator     !=( Value ) )                   return false;
    if( m_IssuingEntityID    != Value.m_IssuingEntityID )    return false;
    if( m_CollidingEntityID  != Value.m_CollidingEntityID )  return false;
    if( m_EventID            != Value.m_EventID )            return false;
    if( m_ui8CollisionType   != Value.m_ui8CollisionType )   return false;
    if( m_Velocity           != Value.m_Velocity )           return false;
    if( m_f32Mass            != Value.m_f32Mass )            return false;
    if( m_Location           != Value.m_Location )           return false;
    return true;
}